

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animations.cpp
# Opt level: O2

void __thiscall FTextureManager::ParseTime(FTextureManager *this,FScanner *sc,DWORD *min,DWORD *max)

{
  bool bVar1;
  DWORD DVar2;
  
  FScanner::MustGetString(sc);
  bVar1 = FScanner::Compare(sc,"tics");
  if (bVar1) {
    FScanner::MustGetFloat(sc);
    DVar2 = (DWORD)(long)((sc->Float * 1000.0) / 35.0);
    *max = DVar2;
    *min = DVar2;
  }
  else {
    bVar1 = FScanner::Compare(sc,"rand");
    if (!bVar1) {
      *max = 1;
      *min = 1;
      FScanner::ScriptError(sc,"Must specify a duration for animation frame");
      return;
    }
    FScanner::MustGetFloat(sc);
    *min = (DWORD)(long)((sc->Float * 1000.0) / 35.0);
    FScanner::MustGetFloat(sc);
    *max = (DWORD)(long)((sc->Float * 1000.0) / 35.0);
  }
  return;
}

Assistant:

void FTextureManager::ParseTime (FScanner &sc, DWORD &min, DWORD &max)
{
	sc.MustGetString ();
	if (sc.Compare ("tics"))
	{
		sc.MustGetFloat ();
		min = max = DWORD(sc.Float * 1000 / 35);
	}
	else if (sc.Compare ("rand"))
	{
		sc.MustGetFloat ();
		min = DWORD(sc.Float * 1000 / 35);
		sc.MustGetFloat ();
		max = DWORD(sc.Float * 1000 / 35);
	}
	else
	{
		min = max = 1;
		sc.ScriptError ("Must specify a duration for animation frame");
	}
}